

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

void free_timer(JSRuntime *rt,JSOSTimer *th)

{
  int *piVar1;
  int iVar2;
  JSValue v;
  
  piVar1 = (int *)(th->func).u.ptr;
  v = th->func;
  if ((0xfffffff4 < (uint)(th->func).tag) && (iVar2 = *piVar1, *piVar1 = iVar2 + -1, iVar2 < 2)) {
    __JS_FreeValueRT(rt,v);
  }
  js_free_rt(rt,th);
  return;
}

Assistant:

static void free_timer(JSRuntime *rt, JSOSTimer *th)
{
    JS_FreeValueRT(rt, th->func);
    js_free_rt(rt, th);
}